

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# callback.cc
# Opt level: O0

void __thiscall t_server::~t_server(t_server *this)

{
  bool bVar1;
  reference pptVar2;
  t_server *this_local;
  
  while( true ) {
    bVar1 = std::vector<t_client_*,_std::allocator<t_client_*>_>::empty(&this->v_clients);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    pptVar2 = std::vector<t_client_*,_std::allocator<t_client_*>_>::back(&this->v_clients);
    t_client::f_remove(*pptVar2);
  }
  std::vector<t_client_*,_std::allocator<t_client_*>_>::~vector(&this->v_clients);
  return;
}

Assistant:

t_server::~t_server()
{
	while (!v_clients.empty()) v_clients.back()->f_remove();
}